

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O1

void jinit_phuff_encoder(j_compress_ptr cinfo)

{
  jpeg_entropy_encoder *pjVar1;
  
  pjVar1 = (jpeg_entropy_encoder *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,200);
  cinfo->entropy = pjVar1;
  pjVar1->start_pass = start_pass_phuff;
  pjVar1[7].finish_pass = (_func_void_j_compress_ptr *)0x0;
  pjVar1[8].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  pjVar1[7].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  pjVar1[7].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0;
  pjVar1[6].encode_mcu = (_func_boolean_j_compress_ptr_JBLOCKROW_ptr *)0x0;
  pjVar1[6].finish_pass = (_func_void_j_compress_ptr *)0x0;
  pjVar1[5].finish_pass = (_func_void_j_compress_ptr *)0x0;
  pjVar1[6].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  pjVar1[5].start_pass = (_func_void_j_compress_ptr_boolean *)0x0;
  return;
}

Assistant:

GLOBAL(void)
jinit_phuff_encoder(j_compress_ptr cinfo)
{
  phuff_entropy_ptr entropy;
  int i;

  entropy = (phuff_entropy_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(phuff_entropy_encoder));
  cinfo->entropy = (struct jpeg_entropy_encoder *)entropy;
  entropy->pub.start_pass = start_pass_phuff;

  /* Mark tables unallocated */
  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    entropy->derived_tbls[i] = NULL;
    entropy->count_ptrs[i] = NULL;
  }
  entropy->bit_buffer = NULL;   /* needed only in AC refinement scan */
}